

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O0

char ** __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
eat_ws_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char **begin,char *end)

{
  char *pcVar1;
  syntax_option_type sVar2;
  char *in_RDX;
  char **in_RSI;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_RDI;
  bool bVar3;
  bool local_24;
  bool local_22;
  
  sVar2 = compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          ::flags(in_RDI);
  sVar2 = regex_constants::operator&(ignore_white_space,sVar2);
  if (sVar2 != ECMAScript) {
    while( true ) {
      local_22 = false;
      if ((in_RDX != *in_RSI) && (local_22 = true, **in_RSI != '#')) {
        local_22 = compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                   ::is_space_(in_RDI,'\0');
      }
      if (local_22 == false) break;
      pcVar1 = *in_RSI;
      *in_RSI = pcVar1 + 1;
      if (*pcVar1 == '#') {
        do {
          bVar3 = false;
          if (in_RDX != *in_RSI) {
            pcVar1 = *in_RSI;
            *in_RSI = pcVar1 + 1;
            bVar3 = *pcVar1 != '\n';
          }
        } while (bVar3);
      }
      else {
        while( true ) {
          local_24 = false;
          if (in_RDX != *in_RSI) {
            local_24 = compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                       ::is_space_(in_RDI,local_22);
          }
          if (local_24 == false) break;
          *in_RSI = *in_RSI + 1;
        }
      }
    }
  }
  return in_RSI;
}

Assistant:

FwdIter &eat_ws_(FwdIter &begin, FwdIter end)
    {
        if(0 != (regex_constants::ignore_white_space & this->flags()))
        {
            while(end != begin && (BOOST_XPR_CHAR_(char_type, '#') == *begin || this->is_space_(*begin)))
            {
                if(BOOST_XPR_CHAR_(char_type, '#') == *begin++)
                {
                    while(end != begin && BOOST_XPR_CHAR_(char_type, '\n') != *begin++) {}
                }
                else
                {
                    for(; end != begin && this->is_space_(*begin); ++begin) {}
                }
            }
        }

        return begin;
    }